

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  Ch *pCVar4;
  Ch *pCVar5;
  bool bVar6;
  bool bVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte bVar10;
  ulong i;
  ulong uVar11;
  uint i_00;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  bool bVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  pbVar3 = (byte *)is->src_;
  bVar2 = *pbVar3;
  pbVar9 = pbVar3;
  bVar10 = bVar2;
  if (bVar2 == 0x2d) {
    pbVar9 = pbVar3 + 1;
    bVar10 = pbVar3[1];
  }
  pCVar4 = is->dst_;
  pCVar5 = is->head_;
  if (bVar10 == 0x30) {
    uVar13 = (uint)pbVar9[1];
    pbVar8 = pbVar9 + 1;
    dVar18 = 0.0;
    bVar17 = false;
    i = 0;
    bVar7 = false;
    uVar11 = 0;
    bVar6 = false;
    i_00 = 0;
    goto LAB_0011c8e5;
  }
  if ((byte)(bVar10 - 0x31) < 9) {
    i_00 = bVar10 - 0x30;
    uVar11 = 0;
    if (bVar2 == 0x2d) {
LAB_0011c742:
      bVar10 = pbVar9[uVar11 + 1];
      uVar14 = (ulong)bVar10;
      if (9 < (byte)(bVar10 - 0x30)) goto LAB_0011c81a;
      if (i_00 < 0xccccccc) {
LAB_0011c75b:
        i_00 = (i_00 * 10 + (uint)bVar10) - 0x30;
        uVar11 = uVar11 + 1;
        goto LAB_0011c742;
      }
      uVar13 = i_00;
      if (i_00 != 0xccccccc) goto LAB_0011c7c1;
      if (bVar10 < 0x39) goto LAB_0011c75b;
      uVar14 = 0x39;
      uVar13 = 0xccccccc;
LAB_0011c7c1:
      i_00 = uVar13;
      pbVar8 = pbVar9 + uVar11 + 1;
      i = (ulong)i_00;
      if (bVar2 == 0x2d) {
        while( true ) {
          uVar13 = (uint)uVar14;
          if (9 < (byte)((byte)uVar14 - 0x30)) break;
          if ((0xccccccccccccccb < i) && (0x38 < (byte)uVar14 || i != 0xccccccccccccccc))
          goto LAB_0011c87f;
          i = (uVar14 & 0xf) + i * 10;
          uVar11 = (ulong)((int)uVar11 + 1);
          uVar14 = (ulong)pbVar8[1];
          pbVar8 = pbVar8 + 1;
        }
      }
      else {
        while( true ) {
          uVar13 = (uint)uVar14;
          if (9 < (byte)((byte)uVar14 - 0x30)) break;
          if ((0x1999999999999998 < i) && (0x35 < (byte)uVar14 || i != 0x1999999999999999))
          goto LAB_0011c87f;
          i = (uVar14 & 0xf) + i * 10;
          uVar11 = (ulong)((int)uVar11 + 1);
          uVar14 = (ulong)pbVar8[1];
          pbVar8 = pbVar8 + 1;
        }
      }
      dVar18 = 0.0;
      bVar6 = true;
      bVar17 = false;
      bVar7 = false;
    }
    else {
      while( true ) {
        bVar10 = pbVar9[uVar11 + 1];
        uVar14 = (ulong)bVar10;
        if (9 < (byte)(bVar10 - 0x30)) break;
        if ((0x19999998 < i_00) &&
           ((uVar13 = i_00, i_00 != 0x19999999 || (uVar13 = 0x19999999, 0x35 < bVar10))))
        goto LAB_0011c7c1;
        i_00 = (i_00 * 10 + (uint)bVar10) - 0x30;
        uVar11 = uVar11 + 1;
      }
LAB_0011c81a:
      uVar13 = (uint)bVar10;
      pbVar8 = pbVar9 + uVar11 + 1;
      dVar18 = 0.0;
      bVar17 = false;
      i = 0;
      bVar7 = false;
      bVar6 = false;
    }
    goto LAB_0011c8e5;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                  ,0x5fc,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  *(undefined4 *)(this + 0x30) = 3;
  pbVar8 = pbVar9;
LAB_0011cb89:
  *(long *)(this + 0x38) = (long)pbVar9 - (long)pCVar5;
LAB_0011cc18:
  is->src_ = (Ch *)pbVar8;
  is->dst_ = pCVar4;
  is->head_ = pCVar5;
  return;
LAB_0011c87f:
  auVar19._8_4_ = (int)(i >> 0x20);
  auVar19._0_8_ = i;
  auVar19._12_4_ = 0x45300000;
  dVar18 = (auVar19._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
  while (uVar13 = (uint)uVar14, (byte)((char)uVar14 - 0x30U) < 10) {
    dVar18 = dVar18 * 10.0 + (double)(int)(uVar13 - 0x30);
    pbVar9 = pbVar8 + 1;
    pbVar8 = pbVar8 + 1;
    uVar14 = (ulong)*pbVar9;
  }
  bVar17 = true;
  bVar7 = true;
  bVar6 = true;
LAB_0011c8e5:
  if ((char)uVar13 == '.') {
    uVar13 = (uint)pbVar8[1];
    pbVar9 = pbVar8 + 1;
    if ((byte)(pbVar8[1] - 0x3a) < 0xf6) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                      ,0x627,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xe;
      pbVar8 = pbVar9;
    }
    else {
      iVar15 = 0;
      pbVar8 = pbVar9;
      if (!bVar17) {
        if (!bVar6) {
          i = (ulong)i_00;
        }
        iVar15 = 0;
        while ((('/' < (char)(byte)uVar13 && ((byte)uVar13 < 0x3a)) && (i >> 0x35 == 0))) {
          pbVar8 = pbVar9 + 1;
          pbVar9 = pbVar9 + 1;
          iVar15 = iVar15 + -1;
          i = (ulong)(uVar13 - 0x30) + i * 10;
          uVar11 = (ulong)((int)uVar11 + (uint)(i != 0));
          uVar13 = (uint)*pbVar8;
        }
        auVar20._8_4_ = (int)(i >> 0x20);
        auVar20._0_8_ = i;
        auVar20._12_4_ = 0x45300000;
        dVar18 = (auVar20._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
        bVar7 = true;
        pbVar8 = pbVar9;
      }
      while ('/' < (char)(byte)uVar13) {
        if (0x39 < (byte)uVar13) goto LAB_0011ca2a;
        if ((int)uVar11 < 0x11) {
          dVar18 = dVar18 * 10.0 + (double)(int)(uVar13 - 0x30);
          iVar15 = iVar15 + -1;
          if (0.0 < dVar18) {
            uVar11 = (ulong)((int)uVar11 + 1);
          }
        }
        uVar13 = (uint)pbVar8[1];
        pbVar8 = pbVar8 + 1;
      }
      iVar12 = 0;
LAB_0011cb5a:
      if (bVar7) {
        dVar18 = internal::StrtodNormalPrecision(dVar18,iVar12 + iVar15);
        if (1.79769313486232e+308 < dVar18) {
          if (*(int *)(this + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                          ,0x6ab,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
          goto LAB_0011cb7f;
        }
        if (bVar2 == 0x2d) {
          dVar18 = -dVar18;
        }
        bVar17 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::Double(handler,dVar18);
      }
      else if (bVar6) {
        if (bVar2 == 0x2d) {
          bVar17 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::Int64(handler,-i);
        }
        else {
          bVar17 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::Uint64(handler,i);
        }
      }
      else if (bVar2 == 0x2d) {
        bVar17 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::Int(handler,-i_00);
      }
      else {
        bVar17 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::Uint(handler,i_00);
      }
      if (bVar17 != false) goto LAB_0011cc18;
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                      ,0x6c3,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0x10;
      pbVar9 = pbVar3;
    }
  }
  else {
    iVar15 = 0;
LAB_0011ca2a:
    iVar12 = 0;
    if ((uVar13 | 0x20) != 0x65) goto LAB_0011cb5a;
    uVar11 = (ulong)i_00;
    if (bVar6) {
      uVar11 = i;
    }
    if (!bVar7) {
      auVar21._8_4_ = (int)(uVar11 >> 0x20);
      auVar21._0_8_ = uVar11;
      auVar21._12_4_ = 0x45300000;
      dVar18 = (auVar21._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
      bVar7 = true;
    }
    bVar10 = pbVar8[1];
    bVar17 = bVar10 != 0x2b;
    if ((bVar17) && (bVar10 != 0x2d)) {
      pbVar9 = pbVar8 + 1;
      bVar17 = false;
    }
    else {
      bVar10 = pbVar8[2];
      pbVar9 = pbVar8 + 2;
    }
    if (9 < (byte)(bVar10 - 0x30)) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                      ,0x67c,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xf;
      pbVar8 = pbVar9;
      goto LAB_0011cb89;
    }
    pbVar8 = pbVar9 + 1;
    iVar16 = bVar10 - 0x30;
    if (bVar17) {
      if (0 < iVar15) {
        __assert_fail("expFrac <= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                      ,0x667,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      pbVar9 = pbVar8;
      while (pbVar8 = pbVar9, (byte)(*pbVar8 - 0x30) < 10) {
        iVar16 = iVar16 * 10 + (uint)*pbVar8 + -0x30;
        pbVar9 = pbVar8 + 1;
        if ((iVar15 + 0x7ffffff7) / 10 < iVar16) {
          do {
            pbVar1 = pbVar8 + 1;
            pbVar8 = pbVar8 + 1;
            pbVar9 = pbVar8;
          } while ((byte)(*pbVar1 - 0x30) < 10);
        }
      }
LAB_0011cb4e:
      iVar12 = -iVar16;
      if (!bVar17) {
        iVar12 = iVar16;
      }
      goto LAB_0011cb5a;
    }
    do {
      bVar10 = *pbVar8;
      if (9 < (byte)(bVar10 - 0x30)) goto LAB_0011cb4e;
      pbVar8 = pbVar8 + 1;
      iVar16 = iVar16 * 10 + (uint)bVar10 + -0x30;
    } while (iVar16 <= 0x134 - iVar15);
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                    ,0x677,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
LAB_0011cb7f:
    *(undefined4 *)(this + 0x30) = 0xd;
    pbVar9 = pbVar3;
  }
  goto LAB_0011cb89;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            if (Consume(s, 'N')) {
                if (Consume(s, 'a') && Consume(s, 'N')) {
                    d = std::numeric_limits<double>::quiet_NaN();
                    useNanOrInf = true;
                }
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I'))) {
                if (Consume(s, 'n') && Consume(s, 'f')) {
                    d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                    useNanOrInf = true;

                    if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                                && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y')))) {
                        RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
                    }
                }
            }
            
            if (RAPIDJSON_UNLIKELY(!useNanOrInf)) {
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (Consume(s, 'e') || Consume(s, 'E')) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    // (exp + expFrac) must not underflow int => we're detecting when -exp gets
                    // dangerously close to INT_MIN (a pessimistic next digit 9 would push it into
                    // underflow territory):
                    //
                    //        -(exp * 10 + 9) + expFrac >= INT_MIN
                    //   <=>  exp <= (expFrac - INT_MIN - 9) / 10
                    RAPIDJSON_ASSERT(expFrac <= 0);
                    int maxExp = (expFrac + 2147483639) / 10;

                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp)) {
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                StringStream srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               // Use > max, instead of == inf, to fix bogus warning -Wfloat-equal
               if (d > std::numeric_limits<double>::max()) {
                   // Overflow
                   // TODO: internal::StrtodX should report overflow (or underflow)
                   RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
               }

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }